

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O2

TSTNode<unsigned_short> * __thiscall
BurstRecursive<unsigned_short>::operator()
          (BurstRecursive<unsigned_short> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,unsigned_short *oracle,
          size_t depth)

{
  unsigned_short *puVar1;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_00;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_01;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_02;
  uint16_t uVar2;
  uint uVar3;
  TSTNode<unsigned_short> *pTVar4;
  pointer ppuVar5;
  pointer ppuVar6;
  pointer ppuVar7;
  pointer ppuVar8;
  TSTNode<unsigned_short> *pTVar9;
  TSTNode<unsigned_short> *pTVar10;
  ulong uVar11;
  ulong uVar12;
  TSTNode<unsigned_short> *pTVar13;
  BurstSimple<unsigned_short> local_59;
  unsigned_short *local_58;
  TSTNode<unsigned_short> *local_50;
  TSTNode<unsigned_short> *local_48;
  BurstRecursive<unsigned_short> *local_40;
  long local_38;
  
  local_58 = oracle;
  local_40 = this;
  pTVar4 = BurstSimple<unsigned_short>::operator()(&local_59,bucket,oracle,depth);
  this_00 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
            (pTVar4->buckets)._M_elems[0];
  this_01 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
            (pTVar4->buckets)._M_elems[1];
  this_02 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
            (pTVar4->buckets)._M_elems[2];
  uVar11 = (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  ppuVar6 = (this_00->_M_impl).super__Vector_impl_data._M_start;
  ppuVar8 = (this_00->_M_impl).super__Vector_impl_data._M_finish;
  pTVar9 = (TSTNode<unsigned_short> *)((long)ppuVar8 - (long)ppuVar6 >> 3);
  ppuVar5 = (this_01->_M_impl).super__Vector_impl_data._M_start;
  ppuVar7 = (this_01->_M_impl).super__Vector_impl_data._M_finish;
  pTVar10 = (TSTNode<unsigned_short> *)((long)ppuVar7 - (long)ppuVar5 >> 3);
  local_38 = (long)(pTVar10->buckets)._M_elems + (long)(pTVar9->buckets)._M_elems;
  if (((long)(this_02->_M_impl).super__Vector_impl_data._M_finish -
       (long)(this_02->_M_impl).super__Vector_impl_data._M_start >> 3) + local_38 == uVar11) {
    uVar12 = (ulong)((float)uVar11 * 0.7);
    uVar11 = 100;
    if (100 < (uint)uVar12) {
      uVar11 = uVar12;
    }
    pTVar13 = (TSTNode<unsigned_short> *)(uVar11 & 0xffffffff);
    if (pTVar13 < pTVar9) {
      local_50 = pTVar9;
      local_48 = pTVar13;
      for (uVar3 = 0; uVar11 = (ulong)uVar3, uVar11 < (ulong)((long)ppuVar8 - (long)ppuVar6 >> 3);
          uVar3 = uVar3 + 1) {
        uVar2 = get_char<unsigned_short>(ppuVar6[uVar11],depth);
        local_58[uVar11] = uVar2;
        ppuVar6 = (this_00->_M_impl).super__Vector_impl_data._M_start;
        ppuVar8 = (this_00->_M_impl).super__Vector_impl_data._M_finish;
      }
      pTVar9 = operator()(local_40,(vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                                   this_00,local_58,depth);
      (pTVar4->buckets)._M_elems[0] = pTVar9;
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(this_00);
      operator_delete(this_00);
      *(byte *)&(pTVar4->is_tst).super__Base_bitset<1UL>._M_w =
           (byte)(pTVar4->is_tst).super__Base_bitset<1UL>._M_w | 1;
      ppuVar5 = (this_01->_M_impl).super__Vector_impl_data._M_start;
      ppuVar7 = (this_01->_M_impl).super__Vector_impl_data._M_finish;
      pTVar10 = (TSTNode<unsigned_short> *)((long)ppuVar7 - (long)ppuVar5 >> 3);
      pTVar9 = local_50;
      pTVar13 = local_48;
    }
    if ((pTVar13 < pTVar10) && ((char)pTVar4->pivot != '\0')) {
      puVar1 = local_58 + (long)pTVar9;
      local_50 = pTVar4;
      local_48 = pTVar13;
      for (uVar3 = 0; uVar11 = (ulong)uVar3, uVar11 < (ulong)((long)ppuVar7 - (long)ppuVar5 >> 3);
          uVar3 = uVar3 + 1) {
        uVar2 = get_char<unsigned_short>(ppuVar5[uVar11],depth + 2);
        puVar1[uVar11] = uVar2;
        ppuVar5 = (this_01->_M_impl).super__Vector_impl_data._M_start;
        ppuVar7 = (this_01->_M_impl).super__Vector_impl_data._M_finish;
      }
      pTVar9 = operator()(local_40,(vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                                   this_01,puVar1,depth + 2);
      pTVar4 = local_50;
      (local_50->buckets)._M_elems[1] = pTVar9;
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(this_01);
      operator_delete(this_01);
      *(byte *)&(pTVar4->is_tst).super__Base_bitset<1UL>._M_w =
           (byte)(pTVar4->is_tst).super__Base_bitset<1UL>._M_w | 2;
      pTVar13 = local_48;
    }
    ppuVar6 = (this_02->_M_impl).super__Vector_impl_data._M_start;
    ppuVar8 = (this_02->_M_impl).super__Vector_impl_data._M_finish;
    if (pTVar13 < (TSTNode<unsigned_short> *)((long)ppuVar8 - (long)ppuVar6 >> 3)) {
      puVar1 = local_58 + local_38;
      for (uVar3 = 0; uVar11 = (ulong)uVar3, uVar11 < (ulong)((long)ppuVar8 - (long)ppuVar6 >> 3);
          uVar3 = uVar3 + 1) {
        uVar2 = get_char<unsigned_short>(ppuVar6[uVar11],depth);
        puVar1[uVar11] = uVar2;
        ppuVar6 = (this_02->_M_impl).super__Vector_impl_data._M_start;
        ppuVar8 = (this_02->_M_impl).super__Vector_impl_data._M_finish;
      }
      pTVar9 = operator()(local_40,(vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                                   this_02,puVar1,depth);
      (pTVar4->buckets)._M_elems[2] = pTVar9;
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(this_02);
      operator_delete(this_02);
      *(byte *)&(pTVar4->is_tst).super__Base_bitset<1UL>._M_w =
           (byte)(pTVar4->is_tst).super__Base_bitset<1UL>._M_w | 4;
    }
    return pTVar4;
  }
  __assert_fail("bucket0->size() + bucket1->size() + bucket2->size() == bucket.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                ,0x6c,
                "TSTNode<CharT> *BurstRecursive<unsigned short>::operator()(const BucketT &, CharT *, size_t) const [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
               );
}

Assistant:

TSTNode<CharT>*
	operator()(const BucketT& bucket, CharT* oracle, size_t depth) const
	{
		debug() << "BurstRecursive() bucket.size()=" << bucket.size() << " depth=" << depth << "\n"; debug_indent;
		TSTNode<CharT>* new_node
			= BurstSimple<CharT>()(bucket, oracle, depth);
		BucketT* bucket0 = static_cast<BucketT*>(new_node->buckets[0]);
		BucketT* bucket1 = static_cast<BucketT*>(new_node->buckets[1]);
		BucketT* bucket2 = static_cast<BucketT*>(new_node->buckets[2]);
		const unsigned threshold = std::max(100u,
				unsigned(0.7f*bucket.size()));
		assert(bucket0->size() + bucket1->size() + bucket2->size()
				== bucket.size());
		size_t bsize = 0;
		const size_t bsize0 = bucket0->size();
		const size_t bsize1 = bucket1->size();
		if (bucket0->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket0: size()=" << bucket0->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket0->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket0)[i], depth);
			new_node->buckets[0] = this->operator()(*bucket0,
					oracle, depth);
			delete bucket0;
			new_node->is_tst[0] = true;
		}
		bsize += bsize0;
		if (bucket1->size() > threshold and not is_end(new_node->pivot)) {
			debug() << "BurstRecursive() bursting bucket1: size()=" << bucket1->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket1->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket1)[i], depth+sizeof(CharT));
			new_node->buckets[1] = this->operator()(*bucket1,
					oracle+bsize, depth+sizeof(CharT));
			delete bucket1;
			new_node->is_tst[1] = true;
		}
		bsize += bsize1;
		if (bucket2->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket2: size()=" << bucket2->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket2->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket2)[i], depth);
			new_node->buckets[2] = this->operator()(*bucket2,
					oracle+bsize, depth);
			delete bucket2;
			new_node->is_tst[2] = true;
		}
		return new_node;
	}